

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::pumpWebSocketLoop(kj *this,WebSocket *from,WebSocket *to)

{
  undefined2 uVar1;
  long *plVar2;
  undefined8 *puVar3;
  bool bVar4;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  Tag TVar5;
  undefined8 *puVar6;
  Coroutine<void> *this_00;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *promise;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *pOVar7;
  String *pSVar8;
  Array<unsigned_char> *pAVar9;
  Close *pCVar10;
  Promise<void> *pPVar11;
  undefined8 *puVar12;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *__return_storage_ptr__;
  PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
  *__return_storage_ptr___00;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *awaitable;
  undefined8 *puVar13;
  long *plVar14;
  long *plVar15;
  PromiseAwaiter<void> *__return_storage_ptr___01;
  Promise<void> *awaitable_00;
  long *plVar16;
  long *plVar17;
  PromiseAwaiter<void> *__return_storage_ptr___02;
  Promise<void> *awaitable_01;
  long *plVar18;
  PromiseAwaiter<void> *__return_storage_ptr___03;
  Promise<void> *awaitable_02;
  ArrayPtr<const_char> AVar19;
  ArrayPtr<const_unsigned_char> AVar20;
  void *pvVar21;
  undefined4 in_stack_fffffffffffff1b0;
  undefined4 in_stack_fffffffffffff1b4;
  int local_e20;
  int local_de0;
  int local_d80;
  WebSocket *to_local;
  WebSocket *from_local;
  
  puVar6 = (undefined8 *)operator_new(0xba0);
  *puVar6 = pumpWebSocketLoop;
  puVar6[1] = pumpWebSocketLoop;
  puVar12 = puVar6 + 0x166;
  __return_storage_ptr__ =
       (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)(puVar6 + 0x15b);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
       (puVar6 + 0x47);
  awaitable = (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
              (puVar6 + 0x168);
  puVar13 = puVar6 + 0x169;
  plVar14 = puVar6 + 0x16a;
  plVar15 = puVar6 + 0x16b;
  __return_storage_ptr___01 = (PromiseAwaiter<void> *)(puVar6 + 0x83);
  awaitable_00 = (Promise<void> *)(puVar6 + 0x16c);
  plVar16 = puVar6 + 0x16d;
  plVar17 = puVar6 + 0x16e;
  __return_storage_ptr___02 = (PromiseAwaiter<void> *)(puVar6 + 0xba);
  awaitable_01 = (Promise<void> *)(puVar6 + 0x16f);
  plVar18 = puVar6 + 0x170;
  __return_storage_ptr___03 = (PromiseAwaiter<void> *)(puVar6 + 0xf1);
  awaitable_02 = (Promise<void> *)(puVar6 + 0x172);
  this_00 = (Coroutine<void> *)(puVar6 + 2);
  puVar6[0x165] = from;
  *puVar12 = to;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar6 + 0x160),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"pumpWebSocketLoop",0xeb5,0x1a);
  pvVar21 = (void *)puVar6[0x162];
  _::Coroutine<void>::Coroutine(this_00,*(SourceLocation *)(puVar6 + 0x160));
  _::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  _::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar4 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar6 + 0xb9d));
  if (bVar4) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar6 + 0xb9d));
    do {
      plVar2 = (long *)puVar6[0x165];
      (**(code **)(*plVar2 + 0x30))(awaitable,plVar2,0x100000);
      promise = _::Coroutine<void>::
                await_transform<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>>
                          (this_00,awaitable);
      co_await<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                (__return_storage_ptr___00,promise);
      bVar4 = _::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___00);
      if (!bVar4) {
        *(undefined1 *)((long)puVar6 + 0xb9c) = 1;
        kj((void *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),pvVar21);
        if ((extraout_AL & 1) != 0) {
          return (PromiseBase)(PromiseBase)this;
        }
      }
      _::PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
      await_resume(__return_storage_ptr__,__return_storage_ptr___00);
      _::PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
      ~PromiseAwaiter(__return_storage_ptr___00);
      Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~Promise
                (awaitable);
      pOVar7 = OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::_switchSubject
                         (__return_storage_ptr__);
      *puVar13 = pOVar7;
      TVar5 = OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::which
                        ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
                         *puVar13);
      if (TVar5 == _variant0) {
        pSVar8 = OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::get<kj::String>
                           ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
                            *puVar13);
        *plVar14 = (long)pSVar8;
        *plVar15 = *plVar14;
        while (*plVar15 != 0) {
          plVar2 = (long *)*puVar12;
          AVar19 = String::operator_cast_to_ArrayPtr((String *)*plVar14);
          (**(code **)(*plVar2 + 8))(awaitable_00,plVar2,AVar19.ptr,AVar19.size_);
          pPVar11 = _::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,awaitable_00);
          co_await<void>(__return_storage_ptr___01,pPVar11);
          bVar4 = _::PromiseAwaiterBase::await_ready
                            ((PromiseAwaiterBase *)__return_storage_ptr___01);
          if (!bVar4) {
            *(undefined1 *)((long)puVar6 + 0xb9c) = 2;
            kj((void *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),pvVar21);
            if ((extraout_AL_00 & 1) != 0) {
              return (PromiseBase)(PromiseBase)this;
            }
          }
          _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___01);
          _::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___01);
          Promise<void>::~Promise(awaitable_00);
          *plVar15 = 0;
        }
        local_d80 = 6;
      }
      else if (TVar5 == _variant1) {
        pAVar9 = OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>::
                 get<kj::Array<unsigned_char>>
                           ((OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close> *)
                            *puVar13);
        *plVar16 = (long)pAVar9;
        *plVar17 = *plVar16;
        while (*plVar17 != 0) {
          puVar3 = (undefined8 *)*puVar12;
          AVar20 = Array::operator_cast_to_ArrayPtr((Array *)*plVar16);
          (**(code **)*puVar3)(awaitable_01,puVar3,AVar20.ptr,AVar20.size_);
          pPVar11 = _::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,awaitable_01);
          co_await<void>(__return_storage_ptr___02,pPVar11);
          bVar4 = _::PromiseAwaiterBase::await_ready
                            ((PromiseAwaiterBase *)__return_storage_ptr___02);
          if (!bVar4) {
            *(undefined1 *)((long)puVar6 + 0xb9c) = 3;
            kj((void *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),pvVar21);
            if ((extraout_AL_01 & 1) != 0) {
              return (PromiseBase)(PromiseBase)this;
            }
          }
          _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___02);
          _::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___02);
          Promise<void>::~Promise(awaitable_01);
          *plVar17 = 0;
        }
        local_d80 = 6;
      }
      else {
        if (TVar5 == _variant2) {
          pCVar10 = OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::
                    get<kj::WebSocket::Close>
                              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
                               *puVar13);
          *plVar18 = (long)pCVar10;
          puVar6[0x171] = *plVar18;
          if (puVar6[0x171] == 0) {
            local_de0 = 0xd;
          }
          else {
            plVar2 = (long *)*puVar12;
            uVar1 = *(undefined2 *)*plVar18;
            StringPtr::StringPtr
                      ((StringPtr *)(puVar6 + 0x163),(String *)((undefined2 *)*plVar18 + 4));
            (**(code **)(*plVar2 + 0x10))
                      (awaitable_02,plVar2,uVar1,(((StringPtr *)(puVar6 + 0x163))->content).ptr,
                       puVar6[0x164]);
            pPVar11 = _::Coroutine<void>::await_transform<kj::Promise<void>>(this_00,awaitable_02);
            co_await<void>(__return_storage_ptr___03,pPVar11);
            bVar4 = _::PromiseAwaiterBase::await_ready
                              ((PromiseAwaiterBase *)__return_storage_ptr___03);
            if (!bVar4) {
              *(undefined1 *)((long)puVar6 + 0xb9c) = 4;
              kj((void *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),pvVar21);
              if ((extraout_AL_02 & 1) != 0) {
                return (PromiseBase)(PromiseBase)this;
              }
            }
            _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___03);
            _::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___03);
            Promise<void>::~Promise(awaitable_02);
            _::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                      ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
            local_de0 = 3;
          }
          if (local_de0 != 0xd) {
            local_d80 = local_de0;
            goto LAB_00659371;
          }
        }
        local_d80 = 0;
      }
LAB_00659371:
      if ((local_d80 == 0) || (local_d80 == 6)) {
        local_e20 = 0;
      }
      else {
        local_e20 = local_d80;
      }
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
                (__return_storage_ptr__);
    } while (local_e20 == 0);
    if (local_e20 == 3) {
      _::CoroutineBase::final_suspend((CoroutineBase *)this_00);
      bVar4 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar6 + 0xb9e));
      if (!bVar4) {
        *puVar6 = 0;
        *(undefined1 *)((long)puVar6 + 0xb9c) = 5;
        kj((void *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),pvVar21);
        return (PromiseBase)(PromiseBase)this;
      }
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar6 + 0xb9e));
    }
    _::Coroutine<void>::~Coroutine(this_00);
    if (puVar6 != (undefined8 *)0x0) {
      operator_delete(puVar6,0xba0);
    }
  }
  else {
    *(undefined1 *)((long)puVar6 + 0xb9c) = 0;
    kj((void *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),pvVar21);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

static kj::Promise<void> pumpWebSocketLoop(WebSocket& from, WebSocket& to) {
  try {
    while (true) {
      auto message = co_await from.receive();
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(text, kj::String) {
          co_await to.send(text);
        }
        KJ_CASE_ONEOF(data, kj::Array<byte>) {
          co_await to.send(data);
        }
        KJ_CASE_ONEOF(close, WebSocket::Close) {
          // Once a close has passed through, the pump is complete.
          co_await to.close(close.code, close.reason);
          co_return;
        }
      }
      // continue the loop
    }
  } catch (...) {
    // We don't know if it was a read or a write that threw. If it was a read that threw, we need
    // to send a disconnect on the destination. If it was the destination that threw, it
    // shouldn't hurt to disconnect() it again, but we'll catch and squelch any exceptions.
    kj::runCatchingExceptions([&to]() { to.disconnect(); });

    // In any case, this error broke the pump. We should propagate it out as the pump result.
    throw;
  }
}